

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

ggml_tensor * __thiscall
llama_context::build_rope_shift
          (llama_context *this,ggml_context *ctx0,ggml_tensor *cur,ggml_tensor *shift,
          ggml_tensor *factors,float freq_base,float freq_scale,ggml_backend_buffer *bbuf)

{
  llama_model *plVar1;
  pointer puVar2;
  ggml_backend *pgVar3;
  char cVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ggml_tensor *pgVar7;
  pointer puVar8;
  float fVar9;
  float local_64;
  
  plVar1 = this->model;
  if (plVar1->arch == LLM_ARCH_DEEPSEEK2) {
    fVar9 = logf(1.0 / freq_scale);
    local_64 = 1.0 / (fVar9 * 0.1 + 1.0);
  }
  else {
    local_64 = (this->cparams).yarn_attn_factor;
  }
  cVar4 = ggml_is_quantized(cur->type);
  if (cVar4 == '\0') {
    pgVar7 = (ggml_tensor *)
             ggml_rope_ext_inplace
                       (freq_base,freq_scale,(this->cparams).yarn_ext_factor,local_64,
                        (this->cparams).yarn_beta_fast,(this->cparams).yarn_beta_slow,ctx0,cur,shift
                        ,factors,(plVar1->hparams).n_rot,(plVar1->hparams).rope_type,
                        (this->cparams).n_ctx_orig_yarn);
    return pgVar7;
  }
  uVar5 = ggml_cast(ctx0,cur,0);
  if (bbuf != (ggml_backend_buffer *)0x0) {
    puVar2 = (this->backends).
             super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->backends).
                  super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1)
    {
      pgVar3 = (puVar8->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
               super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
               super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl;
      uVar6 = ggml_backend_buffer_get_type(bbuf);
      cVar4 = ggml_backend_supports_buft(pgVar3,uVar6);
      if (cVar4 != '\0') {
        ggml_backend_sched_set_tensor_backend
                  ((this->sched)._M_t.
                   super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                   super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                   super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,uVar5,
                   (puVar8->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                   super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                   super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
        break;
      }
    }
  }
  uVar5 = ggml_rope_ext_inplace
                    (freq_base,freq_scale,(this->cparams).yarn_ext_factor,local_64,
                     (this->cparams).yarn_beta_fast,(this->cparams).yarn_beta_slow,ctx0,uVar5,shift,
                     factors,(plVar1->hparams).n_rot,(plVar1->hparams).rope_type,
                     (this->cparams).n_ctx_orig_yarn);
  pgVar7 = (ggml_tensor *)ggml_cpy(ctx0,uVar5,cur);
  return pgVar7;
}

Assistant:

ggml_tensor * llama_context::build_rope_shift(
        ggml_context * ctx0,
        ggml_tensor * cur,
        ggml_tensor * shift,
        ggml_tensor * factors,
              float   freq_base,
              float   freq_scale,
        ggml_backend_buffer * bbuf) const {
    const auto & n_ctx_orig = cparams.n_ctx_orig_yarn;

    const auto & yarn_ext_factor  = cparams.yarn_ext_factor;
    const auto & yarn_beta_fast   = cparams.yarn_beta_fast;
    const auto & yarn_beta_slow   = cparams.yarn_beta_slow;

    const auto & hparams = model.hparams;

    const auto & n_rot     = hparams.n_rot;
    const auto & rope_type = hparams.rope_type;

    // See llm_build_deepseek2() for why attn_factor has to be scaled for YaRN RoPE to work correctly.
    // See https://github.com/ggerganov/llama.cpp/discussions/7416 for detailed explanation.
    const float yarn_attn_factor = model.arch == LLM_ARCH_DEEPSEEK2 ? 1.0f / (1.0f + 0.1f * logf(1.0f / freq_scale)) : cparams.yarn_attn_factor;

    ggml_tensor * tmp;

    if (ggml_is_quantized(cur->type)) {
        // dequantize to f32 -> RoPE -> quantize back
        tmp = ggml_cast(ctx0, cur, GGML_TYPE_F32);

        if (bbuf) {
            for (const auto & backend : backends) {
                // Figure out which backend KV cache belongs to
                if (ggml_backend_supports_buft(backend.get(), ggml_backend_buffer_get_type(bbuf))) {
                    ggml_backend_sched_set_tensor_backend(sched.get(), tmp, backend.get());
                    break;
                }
            }
        }

        tmp = ggml_rope_ext_inplace(ctx0, tmp,
                shift, factors, n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                yarn_ext_factor, yarn_attn_factor, yarn_beta_fast, yarn_beta_slow);

        tmp = ggml_cpy(ctx0, tmp, cur);
    } else {
        // we rotate only the first n_rot dimensions
        tmp = ggml_rope_ext_inplace(ctx0, cur,
                shift, factors, n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                yarn_ext_factor, yarn_attn_factor, yarn_beta_fast, yarn_beta_slow);
    }

    return tmp;
}